

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

EVclient_sources INT_EVclient_register_source(char *name,EVsource src)

{
  void *pvVar1;
  char *pcVar2;
  long *in_RSI;
  char *in_RDI;
  event_path_data evp;
  CManager_conflict cm;
  size_t in_stack_ffffffffffffffd8;
  void *ptr;
  
  ptr = *(void **)(*in_RSI + 0x118);
  if (*(int *)((long)ptr + 0x30) == 0) {
    pvVar1 = INT_CMmalloc((size_t)ptr);
    *(void **)((long)ptr + 0x38) = pvVar1;
  }
  else {
    pvVar1 = INT_CMrealloc(ptr,in_stack_ffffffffffffffd8);
    *(void **)((long)ptr + 0x38) = pvVar1;
  }
  pcVar2 = strdup(in_RDI);
  *(char **)(*(long *)((long)ptr + 0x38) + (long)*(int *)((long)ptr + 0x30) * 0x10) = pcVar2;
  *(long **)(*(long *)((long)ptr + 0x38) + (long)*(int *)((long)ptr + 0x30) * 0x10 + 8) = in_RSI;
  *(int *)((long)ptr + 0x30) = *(int *)((long)ptr + 0x30) + 1;
  return *(EVclient_sources *)((long)ptr + 0x38);
}

Assistant:

extern EVclient_sources
INT_EVclient_register_source(char *name, EVsource src)
{
    CManager cm = src->cm;
    event_path_data evp = cm->evp;
    if (evp->source_count == 0) {
	evp->sources = malloc(sizeof(evp->sources[0]));
    } else {
	evp->sources = realloc(evp->sources,
			       sizeof(evp->sources[0]) * (evp->source_count + 1));
    }
    evp->sources[evp->source_count].name = strdup(name);
    evp->sources[evp->source_count].src = src;
    evp->source_count++;
    return evp->sources;
}